

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

data_node_type * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::split_upwards
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          int key,int stop_propagation_level,
          vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
          *traversal_path,bool reuse_model,model_node_type **new_parent,bool verbose)

{
  int *piVar1;
  longlong *plVar2;
  uint8_t *puVar3;
  pointer pTVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint8_t uVar7;
  short sVar8;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *pAVar9;
  AlexNode<int,_int> *pAVar10;
  _func_int **pp_Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool bVar16;
  AlexCompare *pAVar17;
  pointer ppAVar18;
  byte bVar19;
  data_node_type *right_leaf;
  ostream *poVar20;
  pointer pTVar21;
  data_node_type *pdVar22;
  data_node_type *pdVar23;
  self_type *psVar24;
  long lVar25;
  int iVar26;
  undefined4 uVar27;
  ulong uVar28;
  byte bVar29;
  pointer ppAVar30;
  int iVar31;
  long lVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  data_node_type *pdVar36;
  data_node_type *pdVar37;
  byte bVar38;
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined8 in_XMM3_Qa;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined8 in_XMM4_Qa;
  double dVar55;
  undefined8 in_XMM5_Qb;
  int local_e0;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *local_d0;
  model_node_type *local_c8;
  AlexCompare *local_c0;
  undefined8 local_b8;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  *local_b0;
  int local_a4;
  model_node_type **local_a0;
  data_node_type *local_98;
  int local_8c;
  double local_88;
  undefined8 uStack_80;
  data_node_type *local_70;
  vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_> to_delete;
  
  local_a4 = stop_propagation_level;
  local_a0 = new_parent;
  if (stop_propagation_level < this->root_node_->level_) {
    __assert_fail("stop_propagation_level >= root_node_->level_",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                  ,0x728,
                  "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                 );
  }
  to_delete.
  super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  to_delete.
  super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  to_delete.
  super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar21 = (traversal_path->
            super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_c8 = pTVar21[-1].node;
  iVar35 = pTVar21[-1].bucketID;
  pAVar9 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
           local_c8->children_[iVar35];
  uVar33 = 1 << ((pAVar9->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
  local_c0 = (AlexCompare *)(ulong)uVar33;
  piVar1 = &(this->stats_).num_sideways_splits;
  *piVar1 = *piVar1 + 1;
  iVar35 = iVar35 - iVar35 % (int)uVar33;
  dVar39 = (double)iVar35;
  iVar26 = iVar35 + uVar33;
  plVar2 = &(this->stats_).num_sideways_split_keys;
  *plVar2 = *plVar2 + (long)pAVar9->num_keys_;
  local_88 = (double)(int)uVar33 * 0.5 + dVar39;
  uStack_80 = 0;
  dVar46 = (double)pAVar9->num_right_out_of_bounds_inserts_ / (double)pAVar9->num_inserts_;
  if (dVar46 <= 0.9) {
    local_b8 = (ulong)local_b8._4_4_ << 0x20;
LAB_0012f2d0:
    bVar19 = 0;
  }
  else {
    auVar48._0_8_ = (double)pAVar9->max_key_;
    auVar48._8_8_ = in_XMM3_Qa;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = (local_c8->super_AlexNode<int,_int>).model_.a_;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (local_c8->super_AlexNode<int,_int>).model_.b_;
    auVar5 = vfmadd213sd_fma(auVar48,auVar52,auVar5);
    if ((auVar5._0_8_ < dVar39) || (local_88 <= auVar5._0_8_)) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_88;
      uVar12 = vcmppd_avx512vl(auVar5,auVar14,0xd);
      auVar53._0_8_ = (double)iVar26;
      auVar53._8_8_ = in_XMM4_Qa;
      uVar13 = vcmppd_avx512vl(auVar5,auVar53,1);
      local_b8 = CONCAT44(local_b8._4_4_,(uint)((byte)uVar12 & 3) & (uint)uVar13);
      goto LAB_0012f2d0;
    }
    local_b8 = (ulong)local_b8._4_4_ << 0x20;
    bVar19 = 1;
  }
  local_98 = (data_node_type *)CONCAT44(local_98._4_4_,iVar26);
  dVar55 = (double)pAVar9->num_left_out_of_bounds_inserts_ / (double)pAVar9->num_inserts_;
  if (dVar55 <= 0.9) {
    dVar43 = (local_c8->super_AlexNode<int,_int>).model_.a_;
    dVar47 = (local_c8->super_AlexNode<int,_int>).model_.b_;
    bVar38 = 0;
  }
  else {
    auVar54._0_8_ = (double)pAVar9->min_key_;
    auVar54._8_8_ = in_XMM5_Qb;
    dVar43 = (local_c8->super_AlexNode<int,_int>).model_.a_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar43;
    dVar47 = (local_c8->super_AlexNode<int,_int>).model_.b_;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar47;
    auVar5 = vfmadd213sd_fma(auVar54,auVar44,auVar49);
    if ((dVar39 <= auVar5._0_8_) && (auVar5._0_8_ < local_88)) {
      bVar38 = 0;
      bVar29 = 1;
      goto LAB_0012f375;
    }
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_88;
    uVar12 = vcmppd_avx512vl(auVar5,auVar15,0xd);
    auVar40._0_8_ = (double)iVar26;
    auVar40._8_8_ = in_XMM5_Qb;
    uVar13 = vcmppd_avx512vl(auVar5,auVar40,1);
    bVar38 = (byte)uVar12 & 3 & (byte)uVar13;
  }
  bVar29 = 0;
LAB_0012f375:
  local_d0 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
              *)((local_88 - dVar47) / dVar43);
  local_b0 = traversal_path;
  local_8c = key;
  iVar26 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
           lower_bound<double>(pAVar9,(double *)&local_d0);
  local_70 = bulk_load_leaf_node_from_existing
                       (this,pAVar9,0,iVar26,true,(FTNode *)0x0,reuse_model,
                        (bool)(0.9 < dVar46 & bVar19),(bool)(0.9 < dVar55 & bVar29));
  auVar51 = ZEXT864((ulong)dVar46);
  right_leaf = bulk_load_leaf_node_from_existing
                         (this,pAVar9,iVar26,pAVar9->data_capacity_,true,(FTNode *)0x0,reuse_model,
                          (bool)(0.9 < dVar46 & (byte)local_b8),(bool)(0.9 < dVar55 & bVar38));
  pdVar37 = local_70;
  uVar7 = (pAVar9->super_AlexNode<int,_int>).duplication_factor_;
  (local_70->super_AlexNode<int,_int>).duplication_factor_ = uVar7;
  (right_leaf->super_AlexNode<int,_int>).duplication_factor_ = uVar7;
  sVar8 = (pAVar9->super_AlexNode<int,_int>).level_;
  (local_70->super_AlexNode<int,_int>).level_ = sVar8;
  (right_leaf->super_AlexNode<int,_int>).level_ = sVar8;
  link_data_nodes(this,pAVar9,local_70,right_leaf);
  local_d0 = pAVar9;
  std::vector<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>::
  emplace_back<alex::AlexNode<int,int>*>
            ((vector<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>> *)&to_delete
             ,(AlexNode<int,_int> **)&local_d0);
  piVar1 = &(this->stats_).num_data_nodes;
  *piVar1 = *piVar1 + -1;
  if (verbose) {
    poVar20 = std::operator<<((ostream *)&std::cout,"[Splitting upwards data node] level ");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,(pAVar9->super_AlexNode<int,_int>).level_)
    ;
    poVar20 = std::operator<<(poVar20,", node addr: ");
    poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
    poVar20 = std::operator<<(poVar20,", node repeats in parent: ");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)local_c0);
    poVar20 = std::operator<<(poVar20,", node indexes in parent: [");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar35);
    poVar20 = std::operator<<(poVar20,", ");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)local_98);
    poVar20 = std::operator<<(poVar20,")");
    poVar20 = std::operator<<(poVar20,", left leaf indexes: [0, ");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar26);
    poVar20 = std::operator<<(poVar20,")");
    poVar20 = std::operator<<(poVar20,", right leaf indexes: [");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar26);
    poVar20 = std::operator<<(poVar20,", ");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,pAVar9->data_capacity_);
    poVar20 = std::operator<<(poVar20,")");
    poVar20 = std::operator<<(poVar20,", new nodes addr: ");
    poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
    poVar20 = std::operator<<(poVar20,",");
    poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
    std::endl<char,std::char_traits<char>>(poVar20);
  }
  dVar39 = (local_c8->super_AlexNode<int,_int>).model_.a_;
  dVar46 = (local_c8->super_AlexNode<int,_int>).model_.b_;
  pTVar21 = (local_b0->
            super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_c0 = (AlexCompare *)&this->field_0xbd;
  lVar32 = (long)(int)((ulong)((long)(local_b0->
                                     super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar21) >>
                      4);
  pdVar36 = right_leaf;
  do {
    lVar25 = lVar32 + -1;
    pAVar9 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
              *)pTVar21[lVar25].node;
    pTVar4 = pTVar21 + lVar25;
    iVar35 = (int)(pAVar9->super_AlexNode<int,_int>).level_;
    local_e0 = (int)lVar32;
    if (iVar35 <= local_a4) {
      if (iVar35 != local_a4) {
        __assert_fail("top_node->level_ == stop_propagation_level",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                      ,0x846,
                      "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                     );
      }
      if (local_e0 ==
          (int)((ulong)((long)(local_b0->
                              super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar21) >> 4)) {
        *local_a0 = (model_node_type *)pAVar9;
      }
      iVar35 = pTVar4->bucketID;
      bVar19 = (pdVar37->super_AlexNode<int,_int>).duplication_factor_;
      iVar26 = 1 << (bVar19 & 0x1f);
      if (verbose) {
        poVar20 = std::operator<<((ostream *)&std::cout,"[Splitting upwards top node] level ");
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,local_a4);
        poVar20 = std::operator<<(poVar20,", node addr: ");
        poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
        poVar20 = std::operator<<(poVar20,", node children: ");
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,*(int *)&pAVar9->allocator_);
        poVar20 = std::operator<<(poVar20,", child index: ");
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar35);
        poVar20 = std::operator<<(poVar20,", child repeats in node: ");
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar26);
        poVar20 = std::operator<<(poVar20,", node repeats in parent: ");
        poVar20 = (ostream *)
                  std::ostream::operator<<
                            (poVar20,1 << ((pAVar9->super_AlexNode<int,_int>).duplication_factor_ &
                                          0x1f));
        std::endl<char,std::char_traits<char>>(poVar20);
      }
      if (bVar19 == 0) {
        piVar1 = &(this->stats_).num_model_node_expansions;
        *piVar1 = *piVar1 + 1;
        plVar2 = &(this->stats_).num_model_node_expansion_pointers;
        *plVar2 = *plVar2 + (long)*(int *)&pAVar9->allocator_;
        AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::expand
                  ((AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)pAVar9,1);
        iVar35 = iVar35 * 2;
        iVar26 = 2;
      }
      else {
        puVar3 = &(pdVar37->super_AlexNode<int,_int>).duplication_factor_;
        *puVar3 = *puVar3 + 0xff;
        puVar3 = &(pdVar36->super_AlexNode<int,_int>).duplication_factor_;
        *puVar3 = *puVar3 + 0xff;
      }
      ppAVar18 = to_delete.
                 super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      iVar35 = iVar35 - iVar35 % iVar26;
      lVar32 = (long)(iVar26 / 2 + iVar35);
      for (lVar25 = (long)iVar35; lVar25 < lVar32; lVar25 = lVar25 + 1) {
        (&(pAVar9->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar25] =
             (_func_int **)pdVar37;
      }
      for (; ppAVar30 = to_delete.
                        super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start, lVar32 < iVar35 + iVar26;
          lVar32 = lVar32 + 1) {
        (&(pAVar9->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar32] =
             (_func_int **)pdVar36;
      }
      for (; ppAVar30 != ppAVar18; ppAVar30 = ppAVar30 + 1) {
        delete_node(this,*ppAVar30);
      }
      auVar42._0_8_ = (double)local_8c;
      auVar42._8_8_ = auVar51._8_8_;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = dVar46;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar39;
      auVar5 = vfmadd132sd_fma(auVar42,auVar45,auVar6);
      if (auVar5._0_8_ < local_88) {
        right_leaf = local_70;
      }
      std::_Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::
      ~_Vector_base(&to_delete.
                     super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                   );
      return right_leaf;
    }
    piVar1 = &(this->stats_).num_model_node_splits;
    *piVar1 = *piVar1 + 1;
    iVar35 = *(int *)&pAVar9->allocator_;
    plVar2 = &(this->stats_).num_model_node_split_pointers;
    *plVar2 = *plVar2 + (long)iVar35;
    iVar35 = iVar35 / 2;
    local_c8 = (model_node_type *)CONCAT44(local_c8._4_4_,pTVar4->bucketID);
    local_b8 = lVar25;
    if (pTVar4->bucketID < iVar35) {
      if (1 << (*(byte *)((long)(&(pAVar9->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)
                                [iVar35] + 9) & 0x1f) == iVar35) {
        pdVar22 = (data_node_type *)operator_new(0x40);
        sVar8 = (pAVar9->super_AlexNode<int,_int>).level_;
        (pdVar22->super_AlexNode<int,_int>).is_leaf_ = false;
        (pdVar22->super_AlexNode<int,_int>).duplication_factor_ = '\0';
        pdVar23 = (data_node_type *)0x0;
        (pdVar22->super_AlexNode<int,_int>).level_ = sVar8;
        (pdVar22->super_AlexNode<int,_int>).model_.a_ = 0.0;
        (pdVar22->super_AlexNode<int,_int>).model_.b_ = 0.0;
        (pdVar22->super_AlexNode<int,_int>).cost_ = 0.0;
        (pdVar22->super_AlexNode<int,_int>)._vptr_AlexNode =
             (_func_int **)&PTR__AlexModelNode_00156b98;
        pdVar22->key_less_ = local_c0;
        *(int *)&pdVar22->allocator_ = 0;
        pdVar22->next_leaf_ = (self_type *)0x0;
        bVar16 = true;
      }
      else {
LAB_0012f77e:
        local_98 = pdVar36;
        pdVar22 = (data_node_type *)operator_new(0x40);
        pAVar17 = local_c0;
        sVar8 = (pAVar9->super_AlexNode<int,_int>).level_;
        (pdVar22->super_AlexNode<int,_int>).is_leaf_ = false;
        (pdVar22->super_AlexNode<int,_int>).duplication_factor_ = '\0';
        (pdVar22->super_AlexNode<int,_int>).level_ = sVar8;
        (pdVar22->super_AlexNode<int,_int>).model_.a_ = 0.0;
        (pdVar22->super_AlexNode<int,_int>).model_.b_ = 0.0;
        (pdVar22->super_AlexNode<int,_int>).cost_ = 0.0;
        (pdVar22->super_AlexNode<int,_int>)._vptr_AlexNode =
             (_func_int **)&PTR__AlexModelNode_00156b98;
        pdVar22->key_less_ = local_c0;
        *(int *)&pdVar22->allocator_ = 0;
        pdVar22->next_leaf_ = (self_type *)0x0;
        pdVar23 = (data_node_type *)operator_new(0x40);
        sVar8 = (pAVar9->super_AlexNode<int,_int>).level_;
        (pdVar23->super_AlexNode<int,_int>).is_leaf_ = false;
        (pdVar23->super_AlexNode<int,_int>).duplication_factor_ = '\0';
        (pdVar23->super_AlexNode<int,_int>).cost_ = 0.0;
        *(undefined4 *)&pdVar23->allocator_ = 0;
        pdVar23->next_leaf_ = (self_type *)0x0;
        bVar16 = false;
        (pdVar23->super_AlexNode<int,_int>).level_ = sVar8;
        (pdVar23->super_AlexNode<int,_int>).model_.a_ = 0.0;
        (pdVar23->super_AlexNode<int,_int>).model_.b_ = 0.0;
        (pdVar23->super_AlexNode<int,_int>)._vptr_AlexNode =
             (_func_int **)&PTR__AlexModelNode_00156b98;
        pdVar23->key_less_ = pAVar17;
        uVar27 = 0;
        pdVar36 = local_98;
        if (iVar35 <= (int)local_c8) goto LAB_0012f8c3;
      }
      if (local_e0 ==
          (int)((ulong)((long)(local_b0->
                              super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_b0->
                             super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
        *local_a0 = (model_node_type *)pdVar22;
      }
      iVar35 = *(int *)&pAVar9->allocator_;
      *(int *)&pdVar22->allocator_ = iVar35;
      psVar24 = (self_type *)
                __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                          ((new_allocator<alex::AlexNode<int,_int>_*> *)&local_d0,(long)iVar35,
                           (void *)0x0);
      pdVar22->next_leaf_ = psVar24;
      dVar55 = (pAVar9->super_AlexNode<int,_int>).model_.a_;
      dVar43 = (pAVar9->super_AlexNode<int,_int>).model_.b_;
      (pdVar22->super_AlexNode<int,_int>).model_.a_ = dVar55 + dVar55;
      (pdVar22->super_AlexNode<int,_int>).model_.b_ = dVar43 + dVar43;
      iVar26 = *(int *)&pAVar9->allocator_ / 2;
      iVar35 = 0;
      while (iVar35 < iVar26) {
        pAVar10 = (AlexNode<int,_int> *)
                  (&(pAVar9->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[iVar35];
        bVar19 = pAVar10->duplication_factor_;
        iVar31 = (1 << (bVar19 & 0x1f)) + iVar35;
        for (lVar32 = (long)(iVar35 * 2); lVar32 < iVar31 * 2; lVar32 = lVar32 + 1) {
          (&(pdVar22->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar32] =
               (_func_int **)pAVar10;
        }
        pAVar10->duplication_factor_ = bVar19 + 1;
        iVar35 = iVar31;
      }
      if (iVar35 != iVar26) {
        __assert_fail("cur == cur_node->num_children_ / 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                      ,0x7c6,
                      "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                     );
      }
      if (bVar16) {
        pdVar23 = (data_node_type *)
                  (&(pAVar9->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[iVar26];
        (pdVar23->super_AlexNode<int,_int>).level_ = (pAVar9->super_AlexNode<int,_int>).level_;
      }
      else {
        *(int *)&pdVar23->allocator_ = iVar26;
        psVar24 = (self_type *)
                  __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                            ((new_allocator<alex::AlexNode<int,_int>_*> *)&local_d0,(long)iVar26,
                             (void *)0x0);
        pdVar23->next_leaf_ = psVar24;
        (pdVar23->super_AlexNode<int,_int>).model_.a_ = (pAVar9->super_AlexNode<int,_int>).model_.a_
        ;
        iVar35 = *(int *)&pAVar9->allocator_;
        iVar26 = iVar35 / 2;
        (pdVar23->super_AlexNode<int,_int>).model_.b_ =
             (pAVar9->super_AlexNode<int,_int>).model_.b_ - (double)iVar26;
        for (lVar32 = 0; iVar26 + lVar32 < (long)iVar35; lVar32 = lVar32 + 1) {
          (&(pdVar23->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar32] =
               (&(pAVar9->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[iVar26 + lVar32];
        }
      }
      uVar28 = (long)pTVar4->bucketID * 2;
      iVar26 = 2 << ((pdVar37->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
      lVar25 = uVar28 - (long)(int)((long)((ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 |
                                          uVar28 & 0xffffffff) % (long)iVar26);
      iVar35 = (int)lVar25;
      lVar32 = (long)((iVar26 >> 1) + iVar35);
      for (; lVar25 < lVar32; lVar25 = lVar25 + 1) {
        (&(pdVar22->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar25] =
             (_func_int **)pdVar37;
      }
      for (; lVar32 < iVar26 + iVar35; lVar32 = lVar32 + 1) {
        (&(pdVar22->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar32] =
             (_func_int **)pdVar36;
      }
      local_c8 = (model_node_type *)((ulong)local_c8 & 0xffffffff00000000);
    }
    else {
      if (1 << (*(byte *)((long)(pAVar9->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode + 9) &
               0x1f) != iVar35) goto LAB_0012f77e;
      pdVar23 = (data_node_type *)operator_new(0x40);
      sVar8 = (pAVar9->super_AlexNode<int,_int>).level_;
      (pdVar23->super_AlexNode<int,_int>).is_leaf_ = false;
      (pdVar23->super_AlexNode<int,_int>).duplication_factor_ = '\0';
      pdVar22 = (data_node_type *)0x0;
      (pdVar23->super_AlexNode<int,_int>).level_ = sVar8;
      (pdVar23->super_AlexNode<int,_int>).model_.a_ = 0.0;
      (pdVar23->super_AlexNode<int,_int>).model_.b_ = 0.0;
      (pdVar23->super_AlexNode<int,_int>).cost_ = 0.0;
      (pdVar23->super_AlexNode<int,_int>)._vptr_AlexNode =
           (_func_int **)&PTR__AlexModelNode_00156b98;
      pdVar23->key_less_ = local_c0;
      *(undefined4 *)&pdVar23->allocator_ = 0;
      pdVar23->next_leaf_ = (self_type *)0x0;
      uVar27 = (undefined4)CONCAT71((uint7)(byte)((ushort)sVar8 >> 8),1);
LAB_0012f8c3:
      if (local_e0 ==
          (int)((ulong)((long)(local_b0->
                              super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_b0->
                             super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
        *local_a0 = (model_node_type *)pdVar23;
      }
      local_c8 = (model_node_type *)CONCAT44(local_c8._4_4_,uVar27);
      if ((char)uVar27 == '\0') {
        iVar35 = *(int *)&pAVar9->allocator_ / 2;
        *(int *)&pdVar22->allocator_ = iVar35;
        psVar24 = (self_type *)
                  __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                            ((new_allocator<alex::AlexNode<int,_int>_*> *)&local_d0,(long)iVar35,
                             (void *)0x0);
        pdVar22->next_leaf_ = psVar24;
        dVar55 = (pAVar9->super_AlexNode<int,_int>).model_.b_;
        (pdVar22->super_AlexNode<int,_int>).model_.a_ = (pAVar9->super_AlexNode<int,_int>).model_.a_
        ;
        (pdVar22->super_AlexNode<int,_int>).model_.b_ = dVar55;
        iVar35 = *(int *)&pAVar9->allocator_;
        for (uVar28 = 0; (uint)(~(iVar35 / 2 >> 0x1f) & iVar35 / 2) != uVar28; uVar28 = uVar28 + 1)
        {
          (&(pdVar22->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[uVar28] =
               (_func_int **)
               (&(pAVar9->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[uVar28];
        }
      }
      else {
        pdVar22 = (data_node_type *)(pAVar9->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode;
        (pdVar22->super_AlexNode<int,_int>).level_ = (pAVar9->super_AlexNode<int,_int>).level_;
        iVar35 = *(int *)&pAVar9->allocator_;
      }
      *(int *)&pdVar23->allocator_ = iVar35;
      psVar24 = (self_type *)
                __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                          ((new_allocator<alex::AlexNode<int,_int>_*> *)&local_d0,(long)iVar35,
                           (void *)0x0);
      pdVar23->next_leaf_ = psVar24;
      iVar35 = *(int *)&pAVar9->allocator_;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = (pAVar9->super_AlexNode<int,_int>).model_.a_;
      auVar51 = ZEXT1664(auVar50);
      uVar28 = (long)iVar35 / 2 & 0xffffffff;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = (pAVar9->super_AlexNode<int,_int>).model_.b_ - (double)(int)((long)iVar35 / 2)
      ;
      auVar5 = vunpcklpd_avx(auVar50,auVar41);
      (pdVar23->super_AlexNode<int,_int>).model_.a_ = auVar5._0_8_ + auVar5._0_8_;
      (pdVar23->super_AlexNode<int,_int>).model_.b_ = auVar5._8_8_ + auVar5._8_8_;
      while( true ) {
        iVar26 = (int)uVar28;
        if (iVar35 <= iVar26) break;
        pp_Var11 = (&(pAVar9->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[iVar26];
        bVar19 = *(byte *)((long)pp_Var11 + 9);
        iVar31 = 1 << (bVar19 & 0x1f);
        iVar34 = iVar26 + iVar35 / -2;
        for (lVar32 = (long)(iVar34 * 2); lVar32 < (iVar31 + iVar34) * 2; lVar32 = lVar32 + 1) {
          (&(pdVar23->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar32] = pp_Var11;
        }
        *(byte *)((long)pp_Var11 + 9) = bVar19 + 1;
        uVar28 = (ulong)(uint)(iVar31 + iVar26);
      }
      if (iVar26 != iVar35) {
        __assert_fail("cur == cur_node->num_children_",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                      ,0x816,
                      "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                     );
      }
      iVar35 = (pTVar4->bucketID + iVar35 / -2) * 2;
      iVar26 = 2 << ((pdVar37->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
      iVar35 = iVar35 - iVar35 % iVar26;
      lVar32 = (long)((iVar26 >> 1) + iVar35);
      for (lVar25 = (long)iVar35; lVar25 < lVar32; lVar25 = lVar25 + 1) {
        (&(pdVar23->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar25] =
             (_func_int **)pdVar37;
      }
      for (; lVar32 < iVar35 + iVar26; lVar32 = lVar32 + 1) {
        (&(pdVar23->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar32] =
             (_func_int **)pdVar36;
      }
      bVar16 = false;
    }
    if ((pdVar23 == (data_node_type *)0x0) || (pdVar22 == (data_node_type *)0x0)) {
      __assert_fail("next_left_split != nullptr && next_right_split != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                    ,0x829,
                    "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                   );
    }
    if (verbose) {
      poVar20 = std::operator<<((ostream *)&std::cout,"[Splitting upwards through-node] level ");
      poVar20 = (ostream *)
                std::ostream::operator<<(poVar20,(pAVar9->super_AlexNode<int,_int>).level_);
      poVar20 = std::operator<<(poVar20,", node addr: ");
      poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
      poVar20 = std::operator<<(poVar20,", node children: ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,pTVar4->node->num_children_);
      poVar20 = std::operator<<(poVar20,", child index: ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,pTVar4->bucketID);
      poVar20 = std::operator<<(poVar20,", child repeats in node: ");
      poVar20 = (ostream *)
                std::ostream::operator<<
                          (poVar20,1 << ((pdVar37->super_AlexNode<int,_int>).duplication_factor_ &
                                        0x1f));
      poVar20 = std::operator<<(poVar20,", node repeats in parent: ");
      poVar20 = (ostream *)
                std::ostream::operator<<
                          (poVar20,1 << ((pTVar4->node->super_AlexNode<int,_int>).
                                         duplication_factor_ & 0x1f));
      poVar20 = std::operator<<(poVar20,", new nodes addr: ");
      poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
      poVar20 = std::operator<<(poVar20,",");
      poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
      std::endl<char,std::char_traits<char>>(poVar20);
    }
    local_d0 = pAVar9;
    std::vector<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>::
    emplace_back<alex::AlexNode<int,int>*>
              ((vector<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>> *)
               &to_delete,(AlexNode<int,_int> **)&local_d0);
    if ((char)local_c8 == '\0' && !bVar16) {
      piVar1 = &(this->stats_).num_model_nodes;
      *piVar1 = *piVar1 + 1;
    }
    uVar7 = (pAVar9->super_AlexNode<int,_int>).duplication_factor_;
    (pdVar22->super_AlexNode<int,_int>).duplication_factor_ = uVar7;
    (pdVar23->super_AlexNode<int,_int>).duplication_factor_ = uVar7;
    pTVar21 = (local_b0->
              super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar32 = local_b8;
    pdVar36 = pdVar23;
    pdVar37 = pdVar22;
  } while( true );
}

Assistant:

data_node_type* split_upwards(
      T key, int stop_propagation_level,
      const std::vector<TraversalNode>& traversal_path, bool reuse_model,
      model_node_type** new_parent, bool verbose = false) {
    assert(stop_propagation_level >= root_node_->level_);
    std::vector<AlexNode<T, P>*> to_delete;  // nodes that need to be deleted

    // Split the data node into two new data nodes
    const TraversalNode& parent_path_node = traversal_path.back();
    model_node_type* parent = parent_path_node.node;
    auto leaf = static_cast<data_node_type*>(
        parent->children_[parent_path_node.bucketID]);
    int leaf_repeats = 1 << (leaf->duplication_factor_);
    int leaf_start_bucketID =
        parent_path_node.bucketID - (parent_path_node.bucketID % leaf_repeats);
    double leaf_mid_bucketID = leaf_start_bucketID + leaf_repeats / 2.0;
    int leaf_end_bucketID =
        leaf_start_bucketID + leaf_repeats;  // first bucket with next child
    stats_.num_sideways_splits++;
    stats_.num_sideways_split_keys += leaf->num_keys_;

    // Determine if either of the two new data nodes will need to adapt to
    // append-mostly behavior
    bool append_mostly_right = leaf->is_append_mostly_right();
    bool left_half_appending_right = false, right_half_appending_right = false;
    if (append_mostly_right) {
      double appending_right_bucketID =
          parent->model_.predict_double(leaf->max_key_);
      if (appending_right_bucketID >= leaf_start_bucketID &&
          appending_right_bucketID < leaf_mid_bucketID) {
        left_half_appending_right = true;
      } else if (appending_right_bucketID >= leaf_mid_bucketID &&
                 appending_right_bucketID < leaf_end_bucketID) {
        right_half_appending_right = true;
      }
    }
    bool append_mostly_left = leaf->is_append_mostly_left();
    bool left_half_appending_left = false, right_half_appending_left = false;
    if (append_mostly_left) {
      double appending_left_bucketID =
          parent->model_.predict_double(leaf->min_key_);
      if (appending_left_bucketID >= leaf_start_bucketID &&
          appending_left_bucketID < leaf_mid_bucketID) {
        left_half_appending_left = true;
      } else if (appending_left_bucketID >= leaf_mid_bucketID &&
                 appending_left_bucketID < leaf_end_bucketID) {
        right_half_appending_left = true;
      }
    }

    int mid_boundary = leaf->lower_bound(
        (leaf_mid_bucketID - parent->model_.b_) / parent->model_.a_);
    data_node_type* left_leaf = bulk_load_leaf_node_from_existing(
        leaf, 0, mid_boundary, true, nullptr, reuse_model,
        append_mostly_right && left_half_appending_right,
        append_mostly_left && left_half_appending_left);
    data_node_type* right_leaf = bulk_load_leaf_node_from_existing(
        leaf, mid_boundary, leaf->data_capacity_, true, nullptr, reuse_model,
        append_mostly_right && right_half_appending_right,
        append_mostly_left && right_half_appending_left);
    // This is the expected duplication factor; it will be correct once we
    // split/expand the parent
    left_leaf->duplication_factor_ = leaf->duplication_factor_;
    right_leaf->duplication_factor_ = leaf->duplication_factor_;
    left_leaf->level_ = leaf->level_;
    right_leaf->level_ = leaf->level_;
    link_data_nodes(leaf, left_leaf, right_leaf);
    to_delete.push_back(leaf);
    stats_.num_data_nodes--;

    if (verbose) {
      std::cout << "[Splitting upwards data node] level " << leaf->level_
                << ", node addr: " << leaf
                << ", node repeats in parent: " << leaf_repeats
                << ", node indexes in parent: [" << leaf_start_bucketID << ", "
                << leaf_end_bucketID << ")"
                << ", left leaf indexes: [0, " << mid_boundary << ")"
                << ", right leaf indexes: [" << mid_boundary << ", "
                << leaf->data_capacity_ << ")"
                << ", new nodes addr: " << left_leaf << "," << right_leaf
                << std::endl;
    }

    // The new data node that the key falls into is the one we return
    data_node_type* new_data_node;
    if (parent->model_.predict_double(key) < leaf_mid_bucketID) {
      new_data_node = left_leaf;
    } else {
      new_data_node = right_leaf;
    }

    // Split all internal nodes from the parent up to the highest node along the
    // traversal path.
    // As this happens, the entries of the traversal path will go stale, which
    // is fine because we no longer use them.
    // Splitting an internal node involves dividing the child pointers into two
    // halves, and doubling the relevant half.
    AlexNode<T, P>* prev_left_split = left_leaf;
    AlexNode<T, P>* prev_right_split = right_leaf;
    int path_idx = static_cast<int>(traversal_path.size()) - 1;
    while (traversal_path[path_idx].node->level_ > stop_propagation_level) {
      // Decide which half to double
      const TraversalNode& path_node = traversal_path[path_idx];
      model_node_type* cur_node = path_node.node;
      stats_.num_model_node_splits++;
      stats_.num_model_node_split_pointers += cur_node->num_children_;
      bool double_left_half = path_node.bucketID < cur_node->num_children_ / 2;
      model_node_type* left_split = nullptr;
      model_node_type* right_split = nullptr;

      // If one of the resulting halves will only have one child pointer, we
      // should "pull up" that child
      bool pull_up_left_child = false, pull_up_right_child = false;
      AlexNode<T, P>* left_half_first_child = cur_node->children_[0];
      AlexNode<T, P>* right_half_first_child =
          cur_node->children_[cur_node->num_children_ / 2];
      if (double_left_half &&
          (1 << right_half_first_child->duplication_factor_) ==
              cur_node->num_children_ / 2) {
        // pull up right child if all children in the right half are the same
        pull_up_right_child = true;
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else if (!double_left_half &&
                 (1 << left_half_first_child->duplication_factor_) ==
                     cur_node->num_children_ / 2) {
        // pull up left child if all children in the left half are the same
        pull_up_left_child = true;
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else {
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      }

      // Do the split
      AlexNode<T, P>* next_left_split = nullptr;
      AlexNode<T, P>* next_right_split = nullptr;
      if (double_left_half) {
        // double left half
        assert(left_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = left_split;
        }
        left_split->num_children_ = cur_node->num_children_;
        left_split->children_ =
            new (pointer_allocator().allocate(left_split->num_children_))
                AlexNode<T, P>*[left_split->num_children_];
        left_split->model_.a_ = cur_node->model_.a_ * 2;
        left_split->model_.b_ = cur_node->model_.b_ * 2;
        int cur = 0;
        while (cur < cur_node->num_children_ / 2) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          for (int i = 2 * cur; i < 2 * (cur + cur_child_repeats); i++) {
            left_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_ / 2);

        if (pull_up_right_child) {
          next_right_split = cur_node->children_[cur_node->num_children_ / 2];
          next_right_split->level_ = cur_node->level_;
        } else {
          right_split->num_children_ = cur_node->num_children_ / 2;
          right_split->children_ =
              new (pointer_allocator().allocate(right_split->num_children_))
                  AlexNode<T, P>*[right_split->num_children_];
          right_split->model_.a_ = cur_node->model_.a_;
          right_split->model_.b_ =
              cur_node->model_.b_ - cur_node->num_children_ / 2;
          int j = 0;
          for (int i = cur_node->num_children_ / 2; i < cur_node->num_children_;
               i++) {
            right_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_right_split = right_split;
        }

        int new_bucketID = path_node.bucketID * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          left_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          left_split->children_[i] = prev_right_split;
        }
        next_left_split = left_split;
      } else {
        // double right half
        assert(right_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = right_split;
        }
        if (pull_up_left_child) {
          next_left_split = cur_node->children_[0];
          next_left_split->level_ = cur_node->level_;
        } else {
          left_split->num_children_ = cur_node->num_children_ / 2;
          left_split->children_ =
              new (pointer_allocator().allocate(left_split->num_children_))
                  AlexNode<T, P>*[left_split->num_children_];
          left_split->model_.a_ = cur_node->model_.a_;
          left_split->model_.b_ = cur_node->model_.b_;
          int j = 0;
          for (int i = 0; i < cur_node->num_children_ / 2; i++) {
            left_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_left_split = left_split;
        }

        right_split->num_children_ = cur_node->num_children_;
        right_split->children_ =
            new (pointer_allocator().allocate(right_split->num_children_))
                AlexNode<T, P>*[right_split->num_children_];
        right_split->model_.a_ = cur_node->model_.a_ * 2;
        right_split->model_.b_ =
            (cur_node->model_.b_ - cur_node->num_children_ / 2) * 2;
        int cur = cur_node->num_children_ / 2;
        while (cur < cur_node->num_children_) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          int right_child_idx = cur - cur_node->num_children_ / 2;
          for (int i = 2 * right_child_idx;
               i < 2 * (right_child_idx + cur_child_repeats); i++) {
            right_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_);

        int new_bucketID =
            (path_node.bucketID - cur_node->num_children_ / 2) * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          right_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          right_split->children_[i] = prev_right_split;
        }
        next_right_split = right_split;
      }
      assert(next_left_split != nullptr && next_right_split != nullptr);
      if (verbose) {
        std::cout << "[Splitting upwards through-node] level "
                  << cur_node->level_ << ", node addr: " << path_node.node
                  << ", node children: " << path_node.node->num_children_
                  << ", child index: " << path_node.bucketID
                  << ", child repeats in node: "
                  << (1 << prev_left_split->duplication_factor_)
                  << ", node repeats in parent: "
                  << (1 << path_node.node->duplication_factor_)
                  << ", new nodes addr: " << left_split << "," << right_split
                  << std::endl;
      }
      to_delete.push_back(cur_node);
      if (!pull_up_left_child && !pull_up_right_child) {
        stats_.num_model_nodes++;
      }
      // This is the expected duplication factor; it will be correct once we
      // split/expand the parent
      next_left_split->duplication_factor_ = cur_node->duplication_factor_;
      next_right_split->duplication_factor_ = cur_node->duplication_factor_;
      prev_left_split = next_left_split;
      prev_right_split = next_right_split;
      path_idx--;
    }

    // Insert into the top node
    const TraversalNode& top_path_node = traversal_path[path_idx];
    model_node_type* top_node = top_path_node.node;
    assert(top_node->level_ == stop_propagation_level);
    if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
      *new_parent = top_node;
    }
    int top_bucketID = top_path_node.bucketID;
    int repeats =
        1 << prev_left_split->duplication_factor_;  // this was the duplication
                                                    // factor of the child that
                                                    // was deleted
    if (verbose) {
      std::cout << "[Splitting upwards top node] level "
                << stop_propagation_level << ", node addr: " << top_node
                << ", node children: " << top_node->num_children_
                << ", child index: " << top_bucketID
                << ", child repeats in node: " << repeats
                << ", node repeats in parent: "
                << (1 << top_node->duplication_factor_) << std::endl;
    }

    // Expand the top node if necessary
    if (repeats == 1) {
      stats_.num_model_node_expansions++;
      stats_.num_model_node_expansion_pointers += top_node->num_children_;
      top_node->expand(1);  // double size of top node
      top_bucketID *= 2;
      repeats *= 2;
    } else {
      prev_left_split->duplication_factor_--;
      prev_right_split->duplication_factor_--;
    }

    int start_bucketID =
        top_bucketID -
        (top_bucketID % repeats);  // first bucket with same child
    int mid_bucketID = start_bucketID + repeats / 2;
    int end_bucketID =
        start_bucketID + repeats;  // first bucket with next child
    for (int i = start_bucketID; i < mid_bucketID; i++) {
      top_node->children_[i] = prev_left_split;
    }
    for (int i = mid_bucketID; i < end_bucketID; i++) {
      top_node->children_[i] = prev_right_split;
    }

    for (auto node : to_delete) {
      delete_node(node);
    }

    return new_data_node;
  }